

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateBins
          (BamStandardIndex *this,uint32_t *begin,uint32_t *end,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins)

{
  uint uVar1;
  unsigned_short local_3c;
  unsigned_short local_3a;
  unsigned_short local_38;
  unsigned_short local_36;
  unsigned_short local_34 [2];
  
  local_34[1] = 0;
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,local_34 + 1);
  if (*begin >> 0x1a <= *end >> 0x1a) {
    uVar1 = (*begin >> 0x1a) - 1;
    do {
      local_34[0] = (short)uVar1 + 2;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,local_34);
      uVar1 = uVar1 + 1;
    } while (uVar1 < *end >> 0x1a);
  }
  if (*begin >> 0x17 <= *end >> 0x17) {
    uVar1 = (*begin >> 0x17) + 8;
    do {
      uVar1 = uVar1 + 1;
      local_36 = (unsigned_short)uVar1;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_36);
    } while (uVar1 < (*end >> 0x17) + 9);
  }
  if (*begin >> 0x14 <= *end >> 0x14) {
    uVar1 = (*begin >> 0x14) + 0x48;
    do {
      uVar1 = uVar1 + 1;
      local_38 = (unsigned_short)uVar1;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_38);
    } while (uVar1 < (*end >> 0x14) + 0x49);
  }
  if (*begin >> 0x11 <= *end >> 0x11) {
    uVar1 = (*begin >> 0x11) + 0x248;
    do {
      uVar1 = uVar1 + 1;
      local_3a = (unsigned_short)uVar1;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_3a);
    } while (uVar1 < (*end >> 0x11) + 0x249);
  }
  if (*begin >> 0xe <= *end >> 0xe) {
    uVar1 = (*begin >> 0xe) + 0x1248;
    do {
      uVar1 = uVar1 + 1;
      local_3c = (unsigned_short)uVar1;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_3c);
    } while (uVar1 < (*end >> 0xe) + 0x1249);
  }
  return;
}

Assistant:

void BamStandardIndex::CalculateCandidateBins(const uint32_t& begin,
                                              const uint32_t& end,
                                              set<uint16_t>& candidateBins)
{
    // initialize list, bin '0' is always a valid bin
    candidateBins.insert(0);

    // get rest of bins that contain this region
    unsigned int k;
    for (k =    1 + (begin>>26); k <=    1 + (end>>26); ++k) { candidateBins.insert(k); }
    for (k =    9 + (begin>>23); k <=    9 + (end>>23); ++k) { candidateBins.insert(k); }
    for (k =   73 + (begin>>20); k <=   73 + (end>>20); ++k) { candidateBins.insert(k); }
    for (k =  585 + (begin>>17); k <=  585 + (end>>17); ++k) { candidateBins.insert(k); }
    for (k = 4681 + (begin>>14); k <= 4681 + (end>>14); ++k) { candidateBins.insert(k); }
}